

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> T,
              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,int *C,int *B,
              int n,int k)

{
  uint uVar1;
  uint *puVar2;
  reference piVar3;
  difference_type dVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  uint local_b8;
  uint local_a8;
  uint local_9c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  int *local_60;
  int *local_58;
  uint local_4c;
  uint local_48;
  char_type c1;
  char_type c0;
  int pidx;
  int j;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b;
  int k_local;
  int n_local;
  int *B_local;
  int *C_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> T_local;
  
  b._M_current._0_4_ = k;
  b._M_current._4_4_ = n;
  C_local = SA._M_current;
  SA_local = T;
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j);
  c1 = -1;
  if (C == B) {
    local_58 = SA_local._M_current;
    getCounts<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (SA_local,C,b._M_current._4_4_,(int)b._M_current);
  }
  getBuckets<int*,int>(C,B,(int)b._M_current,false);
  c0 = b._M_current._4_4_ + -1;
  puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator[](&SA_local,(long)c0);
  local_4c = *puVar2;
  local_60 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &C_local,(long)B[(int)local_4c]);
  _j = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_60;
  if ((c0 < 1) ||
     (piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator[](&SA_local,(long)(c0 + -1)), (int)local_4c <= *piVar3)) {
    local_9c = c0;
  }
  else {
    local_9c = c0 ^ 0xffffffff;
  }
  local_68 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,0);
  puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_68);
  *puVar2 = local_9c;
  for (pidx = 0; pidx < b._M_current._4_4_; pidx = pidx + 1) {
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&C_local,(long)pidx);
    c0 = *puVar2;
    if (c0 < 1) {
      if (c0 != 0) {
        uVar1 = c0 ^ 0xffffffff;
        puVar2 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&C_local,(long)pidx);
        *puVar2 = uVar1;
      }
    }
    else {
      c0 = c0 - 1;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[](&SA_local,(long)c0);
      local_48 = *puVar2;
      uVar1 = local_48 ^ 0xffffffff;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&C_local,(long)pidx);
      *puVar2 = uVar1;
      if (local_48 != local_4c) {
        dVar4 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &C_local);
        B[(int)local_4c] = (int)dVar4;
        local_4c = local_48;
        local_70 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&C_local,(long)B[(int)local_48]);
        _j = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_70;
      }
      if ((c0 < 1) ||
         (piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator[](&SA_local,(long)(c0 + -1)), (int)local_4c <= *piVar3)) {
        local_a8 = c0;
      }
      else {
        local_a8 = c0 ^ 0xffffffff;
      }
      local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                            0);
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_78);
      *puVar2 = local_a8;
    }
  }
  if (C == B) {
    getCounts<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (SA_local,C,b._M_current._4_4_,(int)b._M_current);
  }
  getBuckets<int*,int>(C,B,(int)b._M_current,true);
  pidx = b._M_current._4_4_ + -1;
  local_4c = 0;
  _j = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&C_local,
                  (long)*B);
  for (; -1 < pidx; pidx = pidx + -1) {
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&C_local,(long)pidx);
    c0 = *puVar2;
    if (c0 < 1) {
      if (c0 == 0) {
        c1 = pidx;
      }
      else {
        uVar1 = c0 ^ 0xffffffff;
        puVar2 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&C_local,(long)pidx);
        *puVar2 = uVar1;
      }
    }
    else {
      c0 = c0 - 1;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[](&SA_local,(long)c0);
      uVar1 = *puVar2;
      local_48 = uVar1;
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator[]((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&C_local,(long)pidx);
      *puVar2 = uVar1;
      if (local_48 != local_4c) {
        dVar4 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &C_local);
        B[(int)local_4c] = (int)dVar4;
        local_4c = local_48;
        _j = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &C_local,(long)B[(int)local_48]);
      }
      if ((c0 < 1) ||
         (piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator[](&SA_local,(long)(c0 + -1)), *piVar3 <= (int)local_4c)) {
        local_b8 = c0;
      }
      else {
        puVar2 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator[](&SA_local,(long)(c0 + -1));
        local_b8 = *puVar2 ^ 0xffffffff;
      }
      this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&j);
      puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(this);
      *puVar2 = local_b8;
    }
  }
  return c1;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}